

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,string *filename)

{
  undefined8 uVar1;
  long local_218;
  ofstream out;
  string *filename_local;
  SoundFontWriter *this_local;
  
  std::ofstream::ofstream(&local_218);
  uVar1 = *(undefined8 *)(local_218 + -0x18);
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions((int)&local_218 + (int)uVar1);
  std::ofstream::open((string *)&local_218,(_Ios_Openmode)filename);
  Write(this,(ostream *)&local_218);
  std::ofstream::~ofstream(&local_218);
  return;
}

Assistant:

void SoundFontWriter::Write(const std::string & filename) {
  std::ofstream out;

  out.exceptions(std::ios::badbit | std::ios::failbit);
  out.open(filename, std::ios::binary);

  Write(out);
}